

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall
minihttp::HttpSocket::SendRequest(HttpSocket *this,string *what,char *extraRequest,void *user)

{
  bool bVar1;
  undefined1 local_100 [8];
  Request req;
  void *user_local;
  char *extraRequest_local;
  string *what_local;
  HttpSocket *this_local;
  
  req.post.data.field_2._8_8_ = user;
  Request::Request((Request *)local_100,what,&(this->super_TcpSocket)._host,
                   (this->super_TcpSocket)._lastport,user);
  if (extraRequest != (char *)0x0) {
    std::__cxx11::string::operator=((string *)(req.resource.field_2._M_local_buf + 8),extraRequest);
  }
  bVar1 = SendRequest(this,(Request *)local_100,false);
  Request::~Request((Request *)local_100);
  return bVar1;
}

Assistant:

bool HttpSocket::SendRequest(const std::string& what, const char *extraRequest /*= NULL*/, void *user /* = NULL */)
{
    Request req(what, _host, _lastport, user);
    if(extraRequest)
        req.extraGetHeaders = extraRequest;
    return SendRequest(req, false);
}